

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O1

void __thiscall
CipherTest_SHA256WithSecretSuffix_Test::TestBody(CipherTest_SHA256WithSecretSuffix_Test *this)

{
  unsigned_long len;
  int iVar1;
  bool bVar2;
  char *message;
  char *in_R9;
  ScopedTrace gtest_trace_604;
  ScopedTrace gtest_trace_602;
  ScopedTrace gtest_trace_598;
  AssertionResult gtest_ar;
  uint8_t computed [32];
  uint8_t expected [32];
  SHA256_CTX ctx;
  uint8_t buf [256];
  ScopedTrace local_24b;
  ScopedTrace local_24a;
  ScopedTrace local_249;
  unsigned_long local_248;
  long *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  unsigned_long local_230;
  unsigned_long local_228;
  undefined1 local_220 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  Bytes local_200;
  AssertHelper local_1f0;
  long local_1e8 [4];
  long local_1c8 [4];
  SHA256_CTX local_1a8;
  uchar local_138 [264];
  
  RAND_bytes(local_138,0x100);
  local_248 = 0;
  do {
    testing::ScopedTrace::ScopedTrace<unsigned_long>
              (&local_249,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x256,&local_248);
    local_228 = 0;
    do {
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                (&local_24a,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x25a,&local_228);
      local_230 = 0;
      bVar2 = false;
      do {
        testing::ScopedTrace::ScopedTrace<unsigned_long>
                  (&local_24b,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x25c,&local_230);
        SHA256(local_138,local_230 + local_248,(uchar *)local_1c8);
        len = local_230;
        SHA256_Init(&local_1a8);
        SHA256_Update(&local_1a8,local_138,local_248);
        iVar1 = EVP_sha256_final_with_secret_suffix
                          ((SHA256_CTX *)&local_1a8,(uint8_t *)local_1e8,local_138 + local_248,len,
                           local_228);
        local_240 = (long *)CONCAT71(local_240._1_7_,iVar1 != 0);
        local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_200);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_220,(internal *)&local_240,
                     (AssertionResult *)
                     "EVP_sha256_final_with_secret_suffix( &ctx, computed, buf + prefix, secret_len, max_len)"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x26b,(char *)CONCAT71(local_220._1_7_,local_220[0]));
          testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_200);
          testing::internal::AssertHelper::~AssertHelper(&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_220._1_7_,local_220[0]) != &local_210) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_220._1_7_,local_220[0]),
                            local_210._M_allocated_capacity + 1);
          }
          if ((long *)local_200.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_200.span_.data_ + 8))();
          }
          if (local_238 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_238,local_238);
          }
          testing::ScopedTrace::~ScopedTrace(&local_24b);
LAB_00241e55:
          iVar1 = 1;
          goto LAB_00241e5a;
        }
        local_240 = local_1c8;
        local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &DAT_00000020;
        local_200.span_.data_ = (uchar *)local_1e8;
        local_200.span_.size_ = 0x20;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_220,"Bytes(expected)","Bytes(computed)",(Bytes *)&local_240,
                   &local_200);
        if (local_220[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_240);
          message = "";
          if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = (local_218->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x26e,message);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_200,(Message *)&local_240);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
          if (local_240 != (long *)0x0) {
            (**(code **)(*local_240 + 8))();
          }
        }
        if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_218,local_218);
        }
        testing::ScopedTrace::~ScopedTrace(&local_24b);
        if (iVar1 == 0) goto LAB_00241e55;
        local_230 = local_230 + 3;
        bVar2 = local_228 < local_230;
      } while (local_230 <= local_228);
      iVar1 = 0;
LAB_00241e5a:
      testing::ScopedTrace::~ScopedTrace(&local_24a);
      if (!bVar2) goto LAB_00241e88;
      local_228 = local_228 + 3;
    } while (local_228 < 0xc0);
    iVar1 = 5;
LAB_00241e88:
    testing::ScopedTrace::~ScopedTrace(&local_249);
    if (((iVar1 != 5) && (iVar1 != 0)) || (local_248 = local_248 + 3, 0x3f < local_248)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(CipherTest, SHA256WithSecretSuffix) {
  uint8_t buf[SHA256_CBLOCK * 4];
  RAND_bytes(buf, sizeof(buf));
  // Hashing should run in time independent of the bytes.
  CONSTTIME_SECRET(buf, sizeof(buf));

  // Exhaustively testing interesting cases in this function is cubic in the
  // block size, so we test in 3-byte increments.
  constexpr size_t kSkip = 3;
  // This value should be less than 8 to test the edge case when the 8-byte
  // length wraps to the next block.
  static_assert(kSkip < 8, "kSkip is too large");

  // |EVP_sha256_final_with_secret_suffix| is sensitive to the public length of
  // the partial block previously hashed. In TLS, this is the HMAC prefix, the
  // header, and the public minimum padding length.
  for (size_t prefix = 0; prefix < SHA256_CBLOCK; prefix += kSkip) {
    SCOPED_TRACE(prefix);
    // The first block is treated differently, so we run with up to three
    // blocks of length variability.
    for (size_t max_len = 0; max_len < 3 * SHA256_CBLOCK; max_len += kSkip) {
      SCOPED_TRACE(max_len);
      for (size_t len = 0; len <= max_len; len += kSkip) {
        SCOPED_TRACE(len);

        uint8_t expected[SHA256_DIGEST_LENGTH];
        SHA256(buf, prefix + len, expected);
        CONSTTIME_DECLASSIFY(expected, sizeof(expected));

        // Make a copy of the secret length to avoid interfering with the loop.
        size_t secret_len = len;
        CONSTTIME_SECRET(&secret_len, sizeof(secret_len));

        SHA256_CTX ctx;
        SHA256_Init(&ctx);
        SHA256_Update(&ctx, buf, prefix);
        uint8_t computed[SHA256_DIGEST_LENGTH];
        ASSERT_TRUE(EVP_sha256_final_with_secret_suffix(
            &ctx, computed, buf + prefix, secret_len, max_len));

        CONSTTIME_DECLASSIFY(computed, sizeof(computed));
        EXPECT_EQ(Bytes(expected), Bytes(computed));
      }
    }
  }
}